

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSRGBDecodeTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_0::ComparisonFunction::ComparisonFunction
          (ComparisonFunction *this,string *funcName,FunctionParameters funcParameters,
          string *funcImplementation)

{
  undefined4 in_register_00000014;
  
  std::__cxx11::string::string((string *)this,(string *)funcName);
  this->parameters = FUNCTIONPARAMETERS_TWO;
  std::__cxx11::string::string
            ((string *)&this->implementation,(string *)CONCAT44(in_register_00000014,funcParameters)
            );
  return;
}

Assistant:

ComparisonFunction		(const std::string& funcName, const FunctionParameters funcParameters, const std::string& funcImplementation)
		: name				(funcName)
		, parameters		(funcParameters)
		, implementation	(funcImplementation) {}